

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

void icetComposite(IceTImage destBuffer,IceTImage srcBuffer,int srcOnTop)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  undefined8 in_RAX;
  IceTFloat *pIVar4;
  IceTFloat *pIVar5;
  ulong uVar6;
  IceTUByte *pIVar7;
  IceTUByte *pIVar8;
  IceTFloat *pIVar9;
  IceTFloat *pIVar10;
  ulong uVar11;
  IceTBitField level;
  long lVar12;
  int iVar13;
  IceTEnum type;
  char *pcVar14;
  int iVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  IceTEnum composite_mode;
  
  uVar2 = 0;
  uVar16 = 0;
  if (destBuffer.opaque_internals != (IceTVoid *)0x0) {
    uVar16 = *(int *)((long)destBuffer.opaque_internals + 0x10) *
             *(int *)((long)destBuffer.opaque_internals + 0xc);
  }
  if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
    uVar2 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
            *(int *)((long)srcBuffer.opaque_internals + 0xc);
  }
  if (uVar16 != uVar2) {
    pcVar14 = "Source and destination sizes don\'t match.";
    iVar15 = 0x7e1;
    goto LAB_001112a8;
  }
  if (destBuffer.opaque_internals != (IceTVoid *)0x0) {
    iVar15 = *(int *)((long)destBuffer.opaque_internals + 4);
    iVar13 = *(int *)((long)destBuffer.opaque_internals + 8);
    if (srcBuffer.opaque_internals == (IceTVoid *)0x0) {
      if (iVar15 == 0xc000) {
        iVar3 = 0xd000;
        iVar15 = 0xc000;
LAB_001111d2:
        if (iVar13 == iVar3) goto LAB_001111da;
      }
    }
    else {
LAB_001111c4:
      if (iVar15 == *(int *)((long)srcBuffer.opaque_internals + 4)) {
        iVar3 = *(int *)((long)srcBuffer.opaque_internals + 8);
        goto LAB_001111d2;
      }
    }
    pcVar14 = "Source and destination types don\'t match.";
    iVar15 = 0x7eb;
LAB_001112a8:
    icetRaiseDiagnostic(pcVar14,0xffffffff,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                        ,iVar15);
    return;
  }
  iVar13 = 0xd000;
  iVar15 = 0xc000;
  if (srcBuffer.opaque_internals != (IceTVoid *)0x0) goto LAB_001111c4;
LAB_001111da:
  composite_mode = (IceTEnum)((ulong)in_RAX >> 0x20);
  icetGetEnumv(0x28,&composite_mode);
  icetTimingBlendBegin();
  if (composite_mode == 0x302) {
    if (iVar13 != 0xd000) {
      icetRaiseDiagnostic("Z buffer ignored during blend composite operation.  Output z buffer meaningless."
                          ,0xfffffffa,3,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                          ,0x822);
    }
    if (iVar15 == 0xc000) {
      pcVar14 = "Compositing image with no data.";
      type = 0xfffffffb;
      level = 3;
      iVar15 = 0x842;
    }
    else {
      if (iVar15 == 0xc002) {
        pIVar4 = icetImageGetColorcf(srcBuffer);
        pIVar5 = icetImageGetColorcf(destBuffer);
        uVar11 = 0;
        if (0 < (int)uVar16) {
          uVar11 = (ulong)uVar16;
        }
        if (srcOnTop == 0) {
          for (lVar12 = 0; uVar11 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
            fVar17 = *(float *)((long)pIVar5 + lVar12 + 0xc);
            fVar18 = 1.0 - fVar17;
            *(float *)((long)pIVar5 + lVar12) =
                 *(float *)((long)pIVar4 + lVar12) * fVar18 + *(float *)((long)pIVar5 + lVar12);
            *(float *)((long)pIVar5 + lVar12 + 4) =
                 *(float *)((long)pIVar4 + lVar12 + 4) * fVar18 +
                 *(float *)((long)pIVar5 + lVar12 + 4);
            *(float *)((long)pIVar5 + lVar12 + 8) =
                 *(float *)((long)pIVar4 + lVar12 + 8) * fVar18 +
                 *(float *)((long)pIVar5 + lVar12 + 8);
            *(float *)((long)pIVar5 + lVar12 + 0xc) =
                 fVar18 * *(float *)((long)pIVar4 + lVar12 + 0xc) + fVar17;
          }
        }
        else {
          for (lVar12 = 0; uVar11 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
            fVar17 = 1.0 - *(float *)((long)pIVar4 + lVar12 + 0xc);
            *(float *)((long)pIVar5 + lVar12) =
                 *(float *)((long)pIVar5 + lVar12) * fVar17 + *(float *)((long)pIVar4 + lVar12);
            *(float *)((long)pIVar5 + lVar12 + 4) =
                 *(float *)((long)pIVar5 + lVar12 + 4) * fVar17 +
                 *(float *)((long)pIVar4 + lVar12 + 4);
            *(float *)((long)pIVar5 + lVar12 + 8) =
                 *(float *)((long)pIVar5 + lVar12 + 8) * fVar17 +
                 *(float *)((long)pIVar4 + lVar12 + 8);
            *(float *)((long)pIVar5 + lVar12 + 0xc) =
                 fVar17 * *(float *)((long)pIVar5 + lVar12 + 0xc) +
                 *(float *)((long)pIVar4 + lVar12 + 0xc);
          }
        }
        goto LAB_001116c0;
      }
      if (iVar15 == 0xc001) {
        pIVar7 = icetImageGetColorcub(srcBuffer);
        pIVar8 = icetImageGetColorcub(destBuffer);
        uVar11 = 0;
        if (0 < (int)uVar16) {
          uVar11 = (ulong)uVar16;
        }
        if (srcOnTop == 0) {
          for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
            bVar1 = pIVar8[uVar6 * 4 + 3];
            uVar2 = bVar1 ^ 0xff;
            pIVar8[uVar6 * 4] = pIVar8[uVar6 * 4] + (char)((pIVar7[uVar6 * 4] * uVar2) / 0xff);
            pIVar8[uVar6 * 4 + 1] =
                 pIVar8[uVar6 * 4 + 1] + (char)((pIVar7[uVar6 * 4 + 1] * uVar2) / 0xff);
            pIVar8[uVar6 * 4 + 2] =
                 pIVar8[uVar6 * 4 + 2] + (char)((pIVar7[uVar6 * 4 + 2] * uVar2) / 0xff);
            pIVar8[uVar6 * 4 + 3] = (char)((pIVar7[uVar6 * 4 + 3] * uVar2) / 0xff) + bVar1;
          }
        }
        else {
          for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
            uVar2 = pIVar7[uVar6 * 4 + 3] ^ 0xff;
            pIVar8[uVar6 * 4] = (char)((pIVar8[uVar6 * 4] * uVar2) / 0xff) + pIVar7[uVar6 * 4];
            pIVar8[uVar6 * 4 + 1] =
                 (char)((pIVar8[uVar6 * 4 + 1] * uVar2) / 0xff) + pIVar7[uVar6 * 4 + 1];
            pIVar8[uVar6 * 4 + 2] =
                 (char)((pIVar8[uVar6 * 4 + 2] * uVar2) / 0xff) + pIVar7[uVar6 * 4 + 2];
            pIVar8[uVar6 * 4 + 3] =
                 (char)((pIVar8[uVar6 * 4 + 3] * uVar2) / 0xff) + pIVar7[uVar6 * 4 + 3];
          }
        }
        goto LAB_001116c0;
      }
      pcVar14 = "Encountered invalid color format.";
      type = 0xffffffff;
      level = 1;
      iVar15 = 0x845;
    }
  }
  else if (composite_mode == 0x301) {
    if (iVar13 == 0xd000) {
      pcVar14 = "Cannot use Z buffer compositing operation with no Z buffer.";
      type = 0xfffffffb;
      level = 1;
      iVar15 = 0x819;
    }
    else if (iVar13 == 0xd001) {
      pIVar4 = icetImageGetDepthcf(srcBuffer);
      pIVar5 = icetImageGetDepthcf(destBuffer);
      if (iVar15 == 0xc002) {
        pIVar9 = icetImageGetColorcf(srcBuffer);
        pIVar10 = icetImageGetColorcf(destBuffer);
        uVar6 = 0;
        uVar11 = (ulong)uVar16;
        if ((int)uVar16 < 1) {
          uVar11 = uVar6;
        }
        for (; uVar11 * 4 != uVar6; uVar6 = uVar6 + 4) {
          if (*(float *)((long)pIVar4 + uVar6) < *(float *)((long)pIVar5 + uVar6)) {
            *(float *)((long)pIVar5 + uVar6) = *(float *)((long)pIVar4 + uVar6);
            pIVar10[uVar6] = pIVar9[uVar6];
            pIVar10[uVar6 + 1] = pIVar9[uVar6 + 1];
            pIVar10[uVar6 + 2] = pIVar9[uVar6 + 2];
            pIVar10[uVar6 + 3] = pIVar9[uVar6 + 3];
          }
        }
        goto LAB_001116c0;
      }
      if (iVar15 == 0xc001) {
        pIVar7 = icetImageGetColorcub(srcBuffer);
        pIVar8 = icetImageGetColorcub(destBuffer);
        uVar6 = 0;
        uVar11 = (ulong)uVar16;
        if ((int)uVar16 < 1) {
          uVar11 = uVar6;
        }
        for (; uVar11 != uVar6; uVar6 = uVar6 + 1) {
          if ((float)pIVar4[uVar6] < (float)pIVar5[uVar6]) {
            pIVar5[uVar6] = pIVar4[uVar6];
            *(undefined4 *)(pIVar8 + uVar6 * 4) = *(undefined4 *)(pIVar7 + uVar6 * 4);
          }
        }
        goto LAB_001116c0;
      }
      if (iVar15 == 0xc000) {
        uVar6 = 0;
        uVar11 = (ulong)uVar16;
        if ((int)uVar16 < 1) {
          uVar11 = uVar6;
        }
        for (; uVar11 != uVar6; uVar6 = uVar6 + 1) {
          if ((float)pIVar4[uVar6] < (float)pIVar5[uVar6]) {
            pIVar5[uVar6] = pIVar4[uVar6];
          }
        }
        goto LAB_001116c0;
      }
      pcVar14 = "Encountered invalid color format.";
      type = 0xffffffff;
      level = 1;
      iVar15 = 0x815;
    }
    else {
      pcVar14 = "Encountered invalid depth format.";
      type = 0xffffffff;
      level = 1;
      iVar15 = 0x81c;
    }
  }
  else {
    pcVar14 = "Encountered invalid composite mode.";
    type = 0xffffffff;
    level = 1;
    iVar15 = 0x849;
  }
  icetRaiseDiagnostic(pcVar14,type,level,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                      ,iVar15);
LAB_001116c0:
  icetTimingBlendEnd();
  return;
}

Assistant:

void icetComposite(IceTImage destBuffer, const IceTImage srcBuffer,
                   int srcOnTop)
{
    IceTSizeType pixels;
    IceTSizeType i;
    IceTEnum composite_mode;
    IceTEnum color_format, depth_format;

    pixels = icetImageGetNumPixels(destBuffer);
    if (pixels != icetImageGetNumPixels(srcBuffer)) {
        icetRaiseError("Source and destination sizes don't match.",
                       ICET_SANITY_CHECK_FAIL);
        return;
    }

    color_format = icetImageGetColorFormat(destBuffer);
    depth_format = icetImageGetDepthFormat(destBuffer);

    if (   (color_format != icetImageGetColorFormat(srcBuffer))
        || (depth_format != icetImageGetDepthFormat(srcBuffer)) ) {
        icetRaiseError("Source and destination types don't match.",
                       ICET_SANITY_CHECK_FAIL);
        return;
    }

    icetGetEnumv(ICET_COMPOSITE_MODE, &composite_mode);

    icetTimingBlendBegin();

    if (composite_mode == ICET_COMPOSITE_MODE_Z_BUFFER) {
        if (depth_format == ICET_IMAGE_DEPTH_FLOAT) {
            const IceTFloat *srcDepthBuffer = icetImageGetDepthf(srcBuffer);
            IceTFloat *destDepthBuffer = icetImageGetDepthf(destBuffer);

            if (color_format == ICET_IMAGE_COLOR_RGBA_UBYTE) {
                const IceTUInt *srcColorBuffer=icetImageGetColorui(srcBuffer);
                IceTUInt *destColorBuffer = icetImageGetColorui(destBuffer);
                for (i = 0; i < pixels; i++) {
                    if (srcDepthBuffer[i] < destDepthBuffer[i]) {
                        destDepthBuffer[i] = srcDepthBuffer[i];
                        destColorBuffer[i] = srcColorBuffer[i];
                    }
                }
            } else if (color_format == ICET_IMAGE_COLOR_RGBA_FLOAT) {
                const IceTFloat *srcColorBuffer = icetImageGetColorf(srcBuffer);
                IceTFloat *destColorBuffer = icetImageGetColorf(destBuffer);
                for (i = 0; i < pixels; i++) {
                    if (srcDepthBuffer[i] < destDepthBuffer[i]) {
                        destDepthBuffer[i] = srcDepthBuffer[i];
                        destColorBuffer[4*i+0] = srcColorBuffer[4*i+0];
                        destColorBuffer[4*i+1] = srcColorBuffer[4*i+1];
                        destColorBuffer[4*i+2] = srcColorBuffer[4*i+2];
                        destColorBuffer[4*i+3] = srcColorBuffer[4*i+3];
                    }
                }
            } else if (color_format == ICET_IMAGE_COLOR_NONE) {
                for (i = 0; i < pixels; i++) {
                    if (srcDepthBuffer[i] < destDepthBuffer[i]) {
                        destDepthBuffer[i] = srcDepthBuffer[i];
                    }
                }
            } else {
                icetRaiseError("Encountered invalid color format.",
                               ICET_SANITY_CHECK_FAIL);
            }
        } else if (depth_format == ICET_IMAGE_DEPTH_NONE) {
            icetRaiseError("Cannot use Z buffer compositing operation with no"
                           " Z buffer.", ICET_INVALID_OPERATION);
        } else {
            icetRaiseError("Encountered invalid depth format.",
                           ICET_SANITY_CHECK_FAIL);
        }
    } else if (composite_mode == ICET_COMPOSITE_MODE_BLEND) {
        if (depth_format != ICET_IMAGE_DEPTH_NONE) {
            icetRaiseWarning("Z buffer ignored during blend composite"
                             " operation.  Output z buffer meaningless.",
                             ICET_INVALID_VALUE);
        }
        if (color_format == ICET_IMAGE_COLOR_RGBA_UBYTE) {
            const IceTUByte *srcColorBuffer = icetImageGetColorcub(srcBuffer);
            IceTUByte *destColorBuffer = icetImageGetColorub(destBuffer);
            if (srcOnTop) {
                for (i = 0; i < pixels; i++) {
                    ICET_OVER_UBYTE(srcColorBuffer + i*4,
                                    destColorBuffer + i*4);
                }
            } else {
                for (i = 0; i < pixels; i++) {
                    ICET_UNDER_UBYTE(srcColorBuffer + i*4,
                                     destColorBuffer + i*4);
                }
            }
        } else if (color_format == ICET_IMAGE_COLOR_RGBA_FLOAT) {
            const IceTFloat *srcColorBuffer = icetImageGetColorcf(srcBuffer);
            IceTFloat *destColorBuffer = icetImageGetColorf(destBuffer);
            if (srcOnTop) {
                for (i = 0; i < pixels; i++) {
                    ICET_OVER_FLOAT(srcColorBuffer + i*4,
                                    destColorBuffer + i*4);
                }
            } else {
                for (i = 0; i < pixels; i++) {
                    ICET_UNDER_FLOAT(srcColorBuffer + i*4,
                                     destColorBuffer + i*4);
                }
            }
        } else if (color_format == ICET_IMAGE_COLOR_NONE) {
            icetRaiseWarning("Compositing image with no data.",
                             ICET_INVALID_OPERATION);
        } else {
            icetRaiseError("Encountered invalid color format.",
                           ICET_SANITY_CHECK_FAIL);
        }
    } else {
        icetRaiseError("Encountered invalid composite mode.",
                       ICET_SANITY_CHECK_FAIL);
    }

    icetTimingBlendEnd();
}